

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shader.cpp
# Opt level: O0

bool anon_unknown.dwarf_ca316::getFileContents
               (string *filename,vector<char,_std::allocator<char>_> *buffer)

{
  bool bVar1;
  char *pcVar2;
  reference pvVar3;
  value_type local_251;
  undefined1 local_250 [16];
  size_type local_240;
  streamsize size;
  long local_228;
  ifstream file;
  vector<char,_std::allocator<char>_> *buffer_local;
  string *filename_local;
  
  pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     (filename);
  std::ifstream::ifstream(&local_228,pcVar2,_S_bin);
  bVar1 = std::ios::operator_cast_to_bool((ios *)((long)&local_228 + *(long *)(local_228 + -0x18)));
  if (bVar1) {
    std::istream::seekg((long)&local_228,_S_beg);
    local_250 = std::istream::tellg();
    local_240 = std::fpos::operator_cast_to_long((fpos *)local_250);
    if (0 < (long)local_240) {
      std::istream::seekg((long)&local_228,_S_beg);
      std::vector<char,_std::allocator<char>_>::resize(buffer,local_240);
      pvVar3 = std::vector<char,_std::allocator<char>_>::operator[](buffer,0);
      std::istream::read((char *)&local_228,(long)pvVar3);
    }
    local_251 = '\0';
    std::vector<char,_std::allocator<char>_>::push_back(buffer,&local_251);
    filename_local._7_1_ = true;
  }
  else {
    filename_local._7_1_ = false;
  }
  std::ifstream::~ifstream(&local_228);
  return filename_local._7_1_;
}

Assistant:

bool getFileContents(const std::string& filename, std::vector<char>& buffer)
    {
        std::ifstream file(filename.c_str(), std::ios_base::binary);
        if (file)
        {
            file.seekg(0, std::ios_base::end);
            std::streamsize size = file.tellg();
            if (size > 0)
            {
                file.seekg(0, std::ios_base::beg);
                buffer.resize(static_cast<std::size_t>(size));
                file.read(&buffer[0], size);
            }
            buffer.push_back('\0');
            return true;
        }
        else
        {
            return false;
        }
    }